

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

bool iDynTree::CreateModelFromDHChain(DHChain *inputChain,Model *outputModel)

{
  char *__s;
  char *pcVar1;
  DHLink *pDVar2;
  Transform *pTVar3;
  char *in_RSI;
  DHChain *in_RDI;
  RevoluteJoint addedJoint;
  Transform dhTransform;
  Axis axisOnZThroughOrigin;
  Axis rot_axis_in_parent_frame;
  Transform parent_H_child;
  string addedLinkName;
  string addedJointName;
  int i;
  string previousLinkName;
  string baseLinkName;
  Link linkDefault;
  SpatialInertia inertiaDefault;
  Model *in_stack_fffffffffffff798;
  Model *in_stack_fffffffffffff7a0;
  DHChain *in_stack_fffffffffffff7a8;
  Axis *in_stack_fffffffffffff7b0;
  Transform *in_stack_fffffffffffff7b8;
  RevoluteJoint *this;
  allocator<char> *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Model *in_stack_fffffffffffff800;
  Transform local_7f0 [32];
  double in_stack_fffffffffffff830;
  double in_stack_fffffffffffff838;
  double in_stack_fffffffffffff840;
  double in_stack_fffffffffffff848;
  Link *in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff858;
  IJointConstPtr in_stack_fffffffffffff860;
  string *in_stack_fffffffffffff868;
  string *in_stack_fffffffffffff870;
  Model *in_stack_fffffffffffff878;
  string local_768 [16];
  Link *in_stack_fffffffffffff8a8;
  string *in_stack_fffffffffffff8b0;
  Model *in_stack_fffffffffffff8b8;
  string *in_stack_fffffffffffff8c0;
  Model *in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff93c;
  string local_6c0 [568];
  Transform local_488 [96];
  Position local_428 [24];
  Direction local_410;
  Axis local_3f8;
  Axis local_3c8;
  Transform local_398 [96];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [36];
  int local_2d4;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [144];
  RotationalInertia local_218 [72];
  undefined1 local_1d0 [448];
  char *local_10;
  DHChain *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  Model::Model(in_stack_fffffffffffff800);
  Model::operator=(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  Model::~Model(in_stack_fffffffffffff7a0);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
  iDynTree::Position::Zero();
  iDynTree::RotationalInertia::Zero();
  iDynTree::SpatialInertia::SpatialInertia
            ((SpatialInertia *)(local_1d0 + 0x18),1.0,(Position *)this_00,local_218);
  Link::Link((Link *)0x3a3384);
  Link::setInertia((Link *)in_stack_fffffffffffff7a0,(SpatialInertia *)in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
  std::allocator<char>::~allocator(&local_2a9);
  Model::addLink(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  std::__cxx11::string::string(local_2d0,local_2a8);
  local_2d4 = 0;
  while( true ) {
    __s = (char *)(long)local_2d4;
    pcVar1 = (char *)DHChain::getNrOfDOFs((DHChain *)0x3a3428);
    if (pcVar1 <= __s) break;
    DHChain::getDOFName_abi_cxx11_(in_stack_fffffffffffff7a8,(size_t)in_stack_fffffffffffff7a0);
    intToString_abi_cxx11_(in_stack_fffffffffffff93c);
    std::operator+((char *)in_stack_fffffffffffff7a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7a0);
    std::__cxx11::string::~string(local_338);
    iDynTree::Transform::Transform(local_398);
    Axis::Axis((Axis *)in_stack_fffffffffffff7a0);
    iDynTree::Direction::Direction(&local_410,0.0,0.0,1.0);
    iDynTree::Position::Zero();
    iDynTree::Axis::Axis(&local_3f8,&local_410,local_428);
    pDVar2 = DHChain::operator()((DHChain *)in_stack_fffffffffffff7a0,
                                 (size_t)in_stack_fffffffffffff798);
    this = (RevoluteJoint *)pDVar2->A;
    DHChain::operator()((DHChain *)in_stack_fffffffffffff7a0,(size_t)in_stack_fffffffffffff798);
    pDVar2 = DHChain::operator()((DHChain *)in_stack_fffffffffffff7a0,
                                 (size_t)in_stack_fffffffffffff798);
    in_stack_fffffffffffff7d0 = (allocator<char> *)pDVar2->D;
    DHChain::operator()((DHChain *)in_stack_fffffffffffff7a0,(size_t)in_stack_fffffffffffff798);
    TransformFromDH(in_stack_fffffffffffff848,in_stack_fffffffffffff840,in_stack_fffffffffffff838,
                    in_stack_fffffffffffff830);
    iDynTree::Transform::operator=(local_398,local_488);
    iDynTree::Axis::operator=(&local_3c8,&local_3f8);
    RevoluteJoint::RevoluteJoint(this,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    Model::addJointAndLink
              (in_stack_fffffffffffff878,in_stack_fffffffffffff870,in_stack_fffffffffffff868,
               in_stack_fffffffffffff860,in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    std::__cxx11::string::operator=(local_2d0,local_318);
    RevoluteJoint::~RevoluteJoint((RevoluteJoint *)0x3a3646);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string(local_2f8);
    local_2d4 = local_2d4 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffff7d0);
  DHChain::getH0(local_8);
  iDynTree::Transform::inverse();
  Model::addAdditionalFrameToLink
            (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8
             ,(Transform *)in_stack_fffffffffffff8b0);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff93f);
  DHChain::getNrOfDOFs((DHChain *)0x3a3834);
  intToString_abi_cxx11_(in_stack_fffffffffffff93c);
  std::operator+(local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff7a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_stack_fffffffffffff7d0);
  pTVar3 = DHChain::getHN(local_8);
  iDynTree::Transform::Transform(local_7f0,pTVar3);
  Model::addAdditionalFrameToLink
            (in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,(string *)in_stack_fffffffffffff8b8
             ,(Transform *)in_stack_fffffffffffff8b0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff878);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff877);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff8b8);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_2d0);
  std::__cxx11::string::~string(local_2a8);
  return true;
}

Assistant:

bool CreateModelFromDHChain(const DHChain& inputChain,
                                  Model& outputModel)
{
    // First we clear the model
    outputModel = Model();

    // All the inertial will be of one kg in the origin
    iDynTree::SpatialInertia inertiaDefault(1.0,Position::Zero(),RotationalInertia::Zero());
    iDynTree::Link linkDefault;
    linkDefault.setInertia(inertiaDefault);

    std::string baseLinkName  = "link0";


    // Then we create a base link
    outputModel.addLink(baseLinkName,linkDefault);

    std::string previousLinkName = baseLinkName;

    for(int i=0; i<inputChain.getNrOfDOFs(); i++)
    {
        std::string addedJointName = inputChain.getDOFName(i);
        std::string addedLinkName = "link"+intToString(i+1);

        Transform parent_H_child;
        Axis rot_axis_in_parent_frame;
        Axis axisOnZThroughOrigin = Axis(Direction(0.0,0.0,1.0),Position::Zero());
        Transform dhTransform = TransformFromDH(inputChain(i).A,inputChain(i).Alpha,inputChain(i).D,inputChain(i).Offset);
        parent_H_child = dhTransform;
        rot_axis_in_parent_frame = axisOnZThroughOrigin;

        RevoluteJoint addedJoint = RevoluteJoint(parent_H_child,rot_axis_in_parent_frame);
        outputModel.addJointAndLink(previousLinkName,
                                    addedJointName,&(addedJoint),
                                    addedLinkName,linkDefault);

        previousLinkName = addedLinkName;
    }

    // Add base and end effector additional frames, using the H0 and HN information
    outputModel.addAdditionalFrameToLink(baseLinkName,"baseFrame",inputChain.getH0().inverse());
    outputModel.addAdditionalFrameToLink("link"+intToString(inputChain.getNrOfDOFs()),"distalFrame",inputChain.getHN());

    return true;
}